

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalysis.cpp
# Opt level: O3

TPZVec<double> * __thiscall
TPZAnalysis::Integrate
          (TPZVec<double> *__return_storage_ptr__,TPZAnalysis *this,string *varname,
          set<int,_std::less<int>,_std::allocator<int>_> *matids)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_node_base *__k;
  _Rb_tree_color _Var2;
  long lVar3;
  TPZCompEl *this_00;
  TPZVec<double> *pTVar4;
  void *pvVar5;
  mapped_type_conflict4 mVar6;
  uint uVar7;
  _Base_ptr p_Var8;
  mapped_type_conflict4 *pmVar9;
  _Base_ptr p_Var10;
  TPZCompEl **ppTVar11;
  TPZGeoEl *pTVar12;
  _Base_ptr p_Var13;
  ulong uVar14;
  ulong uVar15;
  long nelem;
  TPZCompMesh *pTVar16;
  _Self __tmp;
  int matid;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> variableids;
  TPZManVector<double,_3> locres;
  TPZManVector<double,_3> result;
  int local_144;
  TPZVec<double> *local_140;
  _func_int **local_138;
  long local_130;
  TPZManVector<double,_3> local_128;
  undefined **local_f0;
  void *local_e8;
  ulong local_e0;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_d0;
  TPZManVector<double,_3> local_a0;
  TPZManVector<double,_3> local_68;
  
  local_d0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_d0._M_impl.super__Rb_tree_header._M_header;
  local_d0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_d0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  uVar7 = 0;
  local_d0._M_impl.super__Rb_tree_header._M_node_count = 0;
  pTVar16 = this->fCompMesh;
  p_Var10 = (pTVar16->fMaterialVec)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_140 = __return_storage_ptr__;
  local_d0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_d0._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)p_Var10 != &(pTVar16->fMaterialVec)._M_t._M_impl.super__Rb_tree_header) {
    p_Var1 = &(matids->_M_t)._M_impl.super__Rb_tree_header;
    uVar7 = 0;
    do {
      p_Var8 = (matids->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
      if (p_Var8 != (_Base_ptr)0x0) {
        __k = p_Var10 + 1;
        _Var2 = __k->_M_color;
        p_Var13 = &p_Var1->_M_header;
        do {
          if ((int)_Var2 <= (int)*(size_t *)(p_Var8 + 1)) {
            p_Var13 = p_Var8;
          }
          p_Var8 = (&p_Var8->_M_left)[(int)*(size_t *)(p_Var8 + 1) < (int)_Var2];
        } while (p_Var8 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var13 != p_Var1) &&
           ((int)((_Rb_tree_header *)p_Var13)->_M_node_count <= (int)_Var2)) {
          mVar6 = (**(code **)(*(long *)p_Var10[1]._M_parent + 0x80))(p_Var10[1]._M_parent,varname);
          pmVar9 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                   operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                               *)&local_d0,(key_type *)__k);
          *pmVar9 = mVar6;
          p_Var8 = p_Var10[1]._M_parent;
          pmVar9 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                   operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                               *)&local_d0,(key_type *)__k);
          uVar7 = (**(code **)(*(long *)p_Var8 + 0x88))(p_Var8,*pmVar9);
          pTVar16 = this->fCompMesh;
        }
      }
      p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
    } while ((_Rb_tree_header *)p_Var10 !=
             &(pTVar16->fMaterialVec)._M_t._M_impl.super__Rb_tree_header);
  }
  local_130 = (long)(int)uVar7;
  local_a0.super_TPZVec<double>._vptr_TPZVec = (_func_int **)0x0;
  TPZManVector<double,_3>::TPZManVector(&local_68,local_130,(double *)&local_a0);
  lVar3 = (this->fCompMesh->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>.fNElements;
  if (0 < lVar3) {
    p_Var1 = &(matids->_M_t)._M_impl.super__Rb_tree_header;
    nelem = 0;
    local_138 = (_func_int **)&PTR__TPZManVector_01819f98;
    do {
      ppTVar11 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                           (&(this->fCompMesh->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>,
                            nelem);
      this_00 = *ppTVar11;
      if ((this_00 != (TPZCompEl *)0x0) &&
         (pTVar12 = TPZCompEl::Reference(this_00), pTVar12 != (TPZGeoEl *)0x0)) {
        local_144 = pTVar12->fMatId;
        p_Var10 = (matids->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var8 = &p_Var1->_M_header;
        if (p_Var10 != (_Base_ptr)0x0) {
          do {
            if (local_144 <= (int)p_Var10[1]._M_color) {
              p_Var8 = p_Var10;
            }
            p_Var10 = (&p_Var10->_M_left)[(int)p_Var10[1]._M_color < local_144];
          } while (p_Var10 != (_Base_ptr)0x0);
          if (((_Rb_tree_header *)p_Var8 != p_Var1) && ((int)p_Var8[1]._M_color <= local_144)) {
            local_128.super_TPZVec<double>._vptr_TPZVec = (_func_int **)0x0;
            TPZManVector<double,_3>::TPZManVector(&local_a0,local_130,(double *)&local_128);
            pmVar9 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                     ::operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                   *)&local_d0,&local_144);
            (**(code **)(*(long *)this_00 + 0x1c0))(&local_f0,this_00,*pmVar9);
            uVar15 = local_e0;
            local_128.super_TPZVec<double>.fStore = (double *)0x0;
            local_128.super_TPZVec<double>.fNElements = 0;
            local_128.super_TPZVec<double>.fNAlloc = 0;
            local_128.super_TPZVec<double>._vptr_TPZVec = local_138;
            if ((long)local_e0 < 4) {
              local_128.super_TPZVec<double>.fStore = local_128.fExtAlloc;
              if (0 < (long)local_e0) goto LAB_01253585;
            }
            else {
              local_128.super_TPZVec<double>.fStore =
                   (double *)operator_new__(-(ulong)(local_e0 >> 0x3d != 0) | local_e0 * 8);
              local_128.super_TPZVec<double>.fNAlloc = uVar15;
LAB_01253585:
              pvVar5 = local_e8;
              uVar14 = 0;
              do {
                local_128.super_TPZVec<double>.fStore[uVar14] =
                     *(double *)((long)pvVar5 + uVar14 * 8);
                uVar14 = uVar14 + 1;
              } while (uVar15 != uVar14);
            }
            TPZManVector<double,_3>::operator=(&local_a0,&local_128);
            TPZManVector<double,_3>::~TPZManVector(&local_128);
            local_f0 = &PTR__TPZVec_01813df0;
            if (local_e8 != (void *)0x0) {
              operator_delete__(local_e8);
            }
            if (0 < (int)uVar7) {
              uVar15 = 0;
              do {
                local_68.super_TPZVec<double>.fStore[uVar15] =
                     local_a0.super_TPZVec<double>.fStore[uVar15] +
                     local_68.super_TPZVec<double>.fStore[uVar15];
                uVar15 = uVar15 + 1;
              } while (uVar7 != uVar15);
            }
            TPZManVector<double,_3>::~TPZManVector(&local_a0);
          }
        }
      }
      nelem = nelem + 1;
    } while (nelem != lVar3);
  }
  pTVar4 = local_140;
  TPZVec<double>::TPZVec(local_140,&local_68.super_TPZVec<double>);
  TPZManVector<double,_3>::~TPZManVector(&local_68);
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree(&local_d0);
  return pTVar4;
}

Assistant:

TPZVec<STATE> TPZAnalysis::Integrate(const std::string &varname, const std::set<int> &matids)
{
    // the postprocessed index of the varname for each material id
    std::map<int,int> variableids;
    int nvars = 0;
    
    std::map<int,TPZMaterial *>::iterator itmap;
    for (itmap = fCompMesh->MaterialVec().begin(); itmap != fCompMesh->MaterialVec().end(); itmap++) {
        if (matids.find(itmap->first) != matids.end()) {
            variableids[itmap->first] = itmap->second->VariableIndex(varname);
            nvars = itmap->second->NSolutionVariables(variableids[itmap->first]);
        }
    }
    TPZManVector<STATE,3> result(nvars,0.);
    int64_t nelem = fCompMesh->NElements();
    for (int64_t el=0; el<nelem; el++) {
        TPZCompEl *cel = fCompMesh->Element(el);
        if (!cel) {
            continue;
        }
        TPZGeoEl *gel = cel->Reference();
        if (!gel) {
            continue;
        }
        int matid = gel->MaterialId();
        if (matids.find(matid) == matids.end()) {
            continue;
        }
        TPZManVector<STATE,3> locres(nvars,0.);
        locres = cel->IntegrateSolution(variableids[matid]);
        for (int iv=0; iv<nvars; iv++)
        {
            result[iv] += locres[iv];
        }
    }
    return result;
}